

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

type __thiscall
nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
operator=(optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *this,
         optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *other)

{
  undefined8 uVar1;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_28;
  
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&this->contained);
      this->has_value_ = false;
    }
    else {
      local_28.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)&this->contained + 0x10);
      uVar1 = *(undefined8 *)((long)&other->contained + 8);
      local_28.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)&this->contained;
      local_28.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = *(pointer *)((long)&this->contained + 8);
      *(undefined8 *)&this->contained = *(undefined8 *)&other->contained;
      *(undefined8 *)((long)&this->contained + 8) = uVar1;
      *(undefined8 *)((long)&this->contained + 0x10) =
           *(undefined8 *)((long)&other->contained + 0x10);
      *(undefined8 *)&other->contained = 0;
      *(undefined8 *)((long)&other->contained + 8) = 0;
      *(undefined8 *)((long)&other->contained + 0x10) = 0;
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_28);
    }
  }
  else if (other->has_value_ != false) {
    optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::
    initialize<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
              ((optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> *)this,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&other->contained);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }